

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> **args,uint *args_1,uint *args_2)

{
  iterator this_00;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  undefined8 *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>*&,unsigned_int&,unsigned_int&>
                        (in_stack_00000030,(pointer)this,args,args_1,args_2);
  }
  else {
    this_00 = end(in_RDI);
    IntervalMapDetails::Path::Entry::
    Entry<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>>
              (this_00,(LeafNode<unsigned_long,_std::monostate,_11U,_true> *)*in_RSI,*in_RDX,*in_RCX
              );
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }